

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

size_t c4::base64_encode(substr buf,cblob data)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  error_flags eVar4;
  uint uVar5;
  ulong in_RCX;
  byte *in_RDX;
  ulong in_RSI;
  long in_RDI;
  uint32_t val_2;
  uint32_t val_1;
  uint32_t val;
  uchar *d;
  uint32_t sextet_mask;
  size_t pos;
  size_t rem;
  byte *local_40;
  ulong local_30;
  ulong local_28;
  
  local_30 = 0;
  local_40 = in_RDX;
  for (local_28 = in_RCX; 2 < local_28; local_28 = local_28 - 3) {
    uVar2 = (uint)*local_40 << 0x10;
    uVar3 = uVar2 | (uint)local_40[1] << 8;
    uVar5 = (uint)local_40[2];
    if (0x3f < uVar2 >> 0x12) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45c8,"check failed: %s",
                   "((val >> 18) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30) = detail::base64_sextet_to_char_[uVar2 >> 0x12];
    }
    if (0x3f < (uVar3 & 0x3f000) >> 0xc) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45c9,"check failed: %s",
                   "((val >> 12) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 + 1 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 1) =
           detail::base64_sextet_to_char_[(uVar3 & 0x3f000) >> 0xc];
    }
    if (0x3f < ((uVar3 | uVar5) >> 6 & 0x3f)) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45ca,"check failed: %s",
                   "((val >> 6) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 + 2 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 2) =
           detail::base64_sextet_to_char_[(uVar3 | uVar5) >> 6 & 0x3f];
    }
    if (0x3f < (uVar5 & 0x3f)) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45cb,"check failed: %s",
                   "((val ) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 + 3 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 3) = detail::base64_sextet_to_char_[uVar5 & 0x3f];
    }
    local_30 = local_30 + 4;
    local_40 = local_40 + 3;
  }
  if (2 < local_28) {
    eVar4 = get_error_flags();
    if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
      trap_instruction();
    }
    handle_error(0x3fa1ef,(char *)0x45cd,"check failed: %s","rem < 3");
  }
  if (local_28 == 2) {
    uVar2 = (uint)*local_40 << 0x10;
    uVar3 = (uint)local_40[1] << 8;
    if (0x3f < uVar2 >> 0x12) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45d1,"check failed: %s",
                   "((val >> 18) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30) = detail::base64_sextet_to_char_[uVar2 >> 0x12];
    }
    if (0x3f < ((uVar2 | uVar3) >> 0xc & 0x3f)) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45d2,"check failed: %s",
                   "((val >> 12) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 + 1 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 1) =
           detail::base64_sextet_to_char_[(uVar2 | uVar3) >> 0xc & 0x3f];
    }
    if (0x3f < (uVar3 & 0xfc0) >> 6) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45d3,"check failed: %s",
                   "((val >> 6) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 + 2 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 2) = detail::base64_sextet_to_char_[(uVar3 & 0xfc0) >> 6];
    }
    if (local_30 + 3 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 3) = 0x3d;
    }
    local_30 = local_30 + 4;
  }
  else if (local_28 == 1) {
    uVar2 = (uint)*local_40 << 0x10;
    if (0x3f < uVar2 >> 0x12) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45d9,"check failed: %s",
                   "((val >> 18) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30) = detail::base64_sextet_to_char_[uVar2 >> 0x12];
    }
    if (0x3f < (uVar2 >> 0xc & 0x3f)) {
      eVar4 = get_error_flags();
      if (((eVar4 & 1) != 0) && (bVar1 = is_debugger_attached(), bVar1)) {
        trap_instruction();
      }
      handle_error(0x3fa1ef,(char *)0x45da,"check failed: %s",
                   "((val >> 12) & sextet_mask) < sizeof(detail::base64_sextet_to_char_)");
    }
    if (local_30 + 1 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 1) = detail::base64_sextet_to_char_[uVar2 >> 0xc & 0x3f];
    }
    if (local_30 + 2 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 2) = 0x3d;
    }
    if (local_30 + 3 < in_RSI) {
      *(undefined1 *)(in_RDI + local_30 + 3) = 0x3d;
    }
    local_30 = local_30 + 4;
  }
  return local_30;
}

Assistant:

size_t base64_encode(substr buf, cblob data)
{
    #define c4append_(c) { if(pos < buf.len) { buf.str[pos] = (c); } ++pos; }
    #define c4append_idx_(char_idx) \
    {\
         C4_XASSERT((char_idx) < sizeof(detail::base64_sextet_to_char_));\
         c4append_(detail::base64_sextet_to_char_[(char_idx)]);\
    }

    size_t rem, pos = 0;
    constexpr const uint32_t sextet_mask = uint32_t(1 << 6) - 1;
    const unsigned char *C4_RESTRICT d = (unsigned char *) data.buf; // cast to unsigned to avoid wrapping high-bits
    for(rem = data.len; rem >= 3; rem -= 3, d += 3)
    {
        const uint32_t val = ((uint32_t(d[0]) << 16) | (uint32_t(d[1]) << 8) | (uint32_t(d[2])));
        c4append_idx_((val >> 18) & sextet_mask);
        c4append_idx_((val >> 12) & sextet_mask);
        c4append_idx_((val >>  6) & sextet_mask);
        c4append_idx_((val      ) & sextet_mask);
    }
    C4_ASSERT(rem < 3);
    if(rem == 2)
    {
        const uint32_t val = ((uint32_t(d[0]) << 16) | (uint32_t(d[1]) << 8));
        c4append_idx_((val >> 18) & sextet_mask);
        c4append_idx_((val >> 12) & sextet_mask);
        c4append_idx_((val >>  6) & sextet_mask);
        c4append_('=');
    }
    else if(rem == 1)
    {
        const uint32_t val = ((uint32_t(d[0]) << 16));
        c4append_idx_((val >> 18) & sextet_mask);
        c4append_idx_((val >> 12) & sextet_mask);
        c4append_('=');
        c4append_('=');
    }
    return pos;

    #undef c4append_
    #undef c4append_idx_
}